

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

Bool_conflict copy_output_until_stop(EState *s)

{
  Bool_conflict local_11;
  Bool_conflict progress_out;
  EState *s_local;
  
  local_11 = '\0';
  while ((s->strm->avail_out != 0 && (s->state_out_pos < s->numZ))) {
    local_11 = '\x01';
    *s->strm->next_out = s->zbits[s->state_out_pos];
    s->state_out_pos = s->state_out_pos + 1;
    s->strm->avail_out = s->strm->avail_out - 1;
    s->strm->next_out = s->strm->next_out + 1;
    s->strm->total_out_lo32 = s->strm->total_out_lo32 + 1;
    if (s->strm->total_out_lo32 == 0) {
      s->strm->total_out_hi32 = s->strm->total_out_hi32 + 1;
    }
  }
  return local_11;
}

Assistant:

static
Bool copy_output_until_stop ( EState* s )
{
   Bool progress_out = False;

   while (True) {

      /*-- no output space? --*/
      if (s->strm->avail_out == 0) break;

      /*-- block done? --*/
      if (s->state_out_pos >= s->numZ) break;

      progress_out = True;
      *(s->strm->next_out) = s->zbits[s->state_out_pos];
      s->state_out_pos++;
      s->strm->avail_out--;
      s->strm->next_out++;
      s->strm->total_out_lo32++;
      if (s->strm->total_out_lo32 == 0) s->strm->total_out_hi32++;
   }

   return progress_out;
}